

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  xml_attribute_struct *pxVar1;
  namespace_uri_predicate pred_00;
  xml_attribute xVar2;
  char_t *name;
  char *name_00;
  namespace_uri_predicate pred_01;
  namespace_uri_predicate pred;
  xml_node local_40;
  namespace_uri_predicate local_38;
  
  pxVar1 = (node->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    local_40 = xpath_node::node(node);
    name_00 = "";
    if (local_40._root != (xml_node_struct *)0x0) {
      name_00 = "";
      if ((local_40._root)->name != (char_t *)0x0) {
        name_00 = (local_40._root)->name;
      }
    }
    namespace_uri_predicate::namespace_uri_predicate(&local_38,name_00);
    pred_00.prefix_length = local_38.prefix_length;
    pred_00.prefix = local_38.prefix;
    while (local_40._root != (xml_node_struct *)0x0) {
      xVar2 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                        (&local_40,pred_00);
      if (xVar2._attr != (xml_attribute_struct *)0x0) goto LAB_0029ed06;
      local_40 = xml_node::parent(&local_40);
    }
  }
  else {
    local_40 = xpath_node::parent(node);
    name = pxVar1->name;
    if (name == (char_t *)0x0) {
      name = "";
    }
    namespace_uri_predicate::namespace_uri_predicate(&local_38,name);
    if (local_38.prefix != (char_t *)0x0) {
      while (local_40._root != (xml_node_struct *)0x0) {
        pred_01.prefix_length = local_38.prefix_length;
        pred_01.prefix = local_38.prefix;
        xVar2 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                          (&local_40,pred_01);
        if (xVar2._attr != (xml_attribute_struct *)0x0) {
LAB_0029ed06:
          if ((xVar2._attr)->value == (char_t *)0x0) {
            return "";
          }
          return (xVar2._attr)->value;
        }
        local_40 = xml_node::parent(&local_40);
      }
    }
  }
  return "";
}

Assistant:

PUGI_IMPL_FN xml_attribute xpath_node::attribute() const
	{
		return _attribute;
	}